

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

void __thiscall google::protobuf::MapKey::SetType(MapKey *this,CppType type)

{
  pointer pcVar1;
  string *psVar2;
  
  if (this->type_ != type) {
    if (this->type_ == CPPTYPE_STRING) {
      psVar2 = (this->val_).string_value_;
      if ((psVar2 != (string *)0x0) &&
         (pcVar1 = (psVar2->_M_dataplus)._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar1 != &psVar2->field_2)) {
        operator_delete(pcVar1);
      }
      operator_delete(psVar2);
    }
    this->type_ = type;
    if (type == CPPTYPE_STRING) {
      psVar2 = (string *)operator_new(0x20);
      (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
      psVar2->_M_string_length = 0;
      (psVar2->field_2)._M_local_buf[0] = '\0';
      (this->val_).string_value_ = psVar2;
    }
  }
  return;
}

Assistant:

void SetType(FieldDescriptor::CppType type) {
    if (type_ == type) return;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
    type_ = type;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      val_.string_value_ = new std::string;
    }
  }